

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_get_system_info(char *buffer,int buflen)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  undefined4 uVar20;
  undefined8 uVar19;
  undefined4 uVar22;
  undefined8 uVar21;
  undefined4 uVar24;
  undefined8 uVar23;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  char *bd;
  utsname name;
  char *version;
  size_t system_info_length;
  char block [256];
  char *local_50;
  char *append_eoobj;
  char *end;
  char *pcStack_38;
  int buflen_local;
  char *buffer_local;
  
  local_50 = (char *)0x0;
  if ((buffer == (char *)0x0) || (buflen < 1)) {
    end._4_4_ = 0;
    append_eoobj = buffer;
  }
  else {
    *buffer = '\0';
    append_eoobj = buffer + buflen;
    end._4_4_ = buflen;
  }
  if ((3 < end._4_4_) && (local_50 = buffer, append_eoobj != (char *)0x0)) {
    append_eoobj = append_eoobj + -3;
  }
  pcStack_38 = buffer;
  sVar3 = mg_str_append(&stack0xffffffffffffffc8,append_eoobj,"{");
  name.domainname._57_8_ = mg_version();
  mg_snprintf((mg_connection *)0x0,(int *)0x0,(char *)&system_info_length,0x100,
              "%s\"version\" : \"%s\"","\n",name.domainname._57_8_);
  sVar4 = mg_str_append(&stack0xffffffffffffffc8,append_eoobj,(char *)&system_info_length);
  memset((void *)((long)&bd + 2),0,0x186);
  uname((utsname *)((long)&bd + 2));
  mg_snprintf((mg_connection *)0x0,(int *)0x0,(char *)&system_info_length,0x100,
              ",%s\"os\" : \"%s %s (%s) - %s\"","\n",(long)&bd + 2,name.release + 0x39,
              name.nodename + 0x39,name.version + 0x39);
  sVar5 = mg_str_append(&stack0xffffffffffffffc8,append_eoobj,(char *)&system_info_length);
  uVar1 = mg_check_feature(0xffffffff);
  uVar2 = mg_check_feature(1);
  pcVar6 = "";
  if (uVar2 != 0) {
    pcVar6 = " Files";
  }
  uVar2 = mg_check_feature(2);
  pcVar16 = "";
  if (uVar2 != 0) {
    pcVar16 = " HTTPS";
  }
  uVar2 = mg_check_feature(4);
  pcVar15 = "";
  if (uVar2 != 0) {
    pcVar15 = " CGI";
  }
  uVar2 = mg_check_feature(8);
  pcVar18 = "";
  if (uVar2 != 0) {
    pcVar18 = " IPv6";
  }
  uVar2 = mg_check_feature(0x10);
  pcVar17 = "";
  if (uVar2 != 0) {
    pcVar17 = " WebSockets";
  }
  uVar2 = mg_check_feature(0x20);
  pcVar14 = "";
  if (uVar2 != 0) {
    pcVar14 = " Lua";
  }
  uVar2 = mg_check_feature(0x40);
  pcVar7 = "";
  if (uVar2 != 0) {
    pcVar7 = " JavaScript";
  }
  uVar2 = mg_check_feature(0x80);
  pcVar8 = "";
  if (uVar2 != 0) {
    pcVar8 = " Cache";
  }
  uVar2 = mg_check_feature(0x100);
  pcVar13 = "";
  if (uVar2 != 0) {
    pcVar13 = " Stats";
  }
  uVar22 = 0;
  mg_snprintf((mg_connection *)0x0,(int *)0x0,(char *)&system_info_length,0x100,
              ",%s\"features\" : %lu,%s\"feature_list\" : \"Server:%s%s%s%s%s%s%s%s%s\"","\n",
              (ulong)uVar1,"\n",pcVar6,pcVar16,pcVar15,pcVar18,pcVar17,pcVar14,pcVar7,pcVar8,pcVar13
             );
  uVar32 = (undefined4)((ulong)pcVar13 >> 0x20);
  uVar31 = (undefined4)((ulong)pcVar8 >> 0x20);
  uVar30 = (undefined4)((ulong)pcVar7 >> 0x20);
  uVar29 = (undefined4)((ulong)pcVar14 >> 0x20);
  uVar28 = (undefined4)((ulong)pcVar17 >> 0x20);
  uVar27 = (undefined4)((ulong)pcVar18 >> 0x20);
  uVar26 = (undefined4)((ulong)pcVar15 >> 0x20);
  uVar24 = (undefined4)((ulong)pcVar6 >> 0x20);
  sVar9 = mg_str_append(&stack0xffffffffffffffc8,append_eoobj,(char *)&system_info_length);
  uVar20 = 0;
  mg_snprintf((mg_connection *)0x0,(int *)0x0,(char *)&system_info_length,0x100,
              ",%s\"build\" : \"%s\"","\n","Apr 26 2025");
  sVar10 = mg_str_append(&stack0xffffffffffffffc8,append_eoobj,(char *)&system_info_length);
  uVar19 = CONCAT44(uVar20,0x13);
  uVar21 = CONCAT44(uVar22,1);
  uVar23 = CONCAT44(uVar24,5);
  uVar25 = 0;
  mg_snprintf((mg_connection *)0x0,(int *)0x0,(char *)&system_info_length,0x100,
              ",%s\"compiler\" : \"clang: %u.%u.%u (%s)\"","\n",uVar19,uVar21,uVar23,
              "19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
             );
  uVar24 = (undefined4)((ulong)uVar23 >> 0x20);
  uVar22 = (undefined4)((ulong)uVar21 >> 0x20);
  uVar20 = (undefined4)((ulong)uVar19 >> 0x20);
  sVar11 = mg_str_append(&stack0xffffffffffffffc8,append_eoobj,(char *)&system_info_length);
  mg_snprintf((mg_connection *)0x0,(int *)0x0,(char *)&system_info_length,0x100,
              ",%s\"data_model\" : \"int:%u/%u/%u/%u, float:%u/%u/%u, char:%u/%u, ptr:%u, size:%u, time:%u\""
              ,"\n",CONCAT44(uVar20,2),CONCAT44(uVar22,4),CONCAT44(uVar24,8),CONCAT44(uVar25,8),
              CONCAT44(uVar26,4),CONCAT44(uVar27,8),CONCAT44(uVar28,0x10),CONCAT44(uVar29,1),
              CONCAT44(uVar30,4),CONCAT44(uVar31,8),CONCAT44(uVar32,8),8);
  sVar12 = mg_str_append(&stack0xffffffffffffffc8,append_eoobj,(char *)&system_info_length);
  if (local_50 != (char *)0x0) {
    strcat(local_50,"\n}\n");
  }
  return (int)sVar12 + (int)sVar11 + (int)sVar10 + (int)sVar9 + (int)sVar5 + (int)sVar4 + (int)sVar3
         + 3;
}

Assistant:

CIVETWEB_API int
mg_get_system_info(char *buffer, int buflen)
{
	char *end, *append_eoobj = NULL, block[256];
	size_t system_info_length = 0;

#if defined(_WIN32)
	static const char eol[] = "\r\n", eoobj[] = "\r\n}\r\n";
#else
	static const char eol[] = "\n", eoobj[] = "\n}\n";
#endif

	if ((buffer == NULL) || (buflen < 1)) {
		buflen = 0;
		end = buffer;
	} else {
		*buffer = 0;
		end = buffer + buflen;
	}
	if (buflen > (int)(sizeof(eoobj) - 1)) {
		/* has enough space to append eoobj */
		append_eoobj = buffer;
		if (end) {
			end -= sizeof(eoobj) - 1;
		}
	}

	system_info_length += mg_str_append(&buffer, end, "{");

	/* Server version */
	{
		const char *version = mg_version();
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            "%s\"version\" : \"%s\"",
		            eol,
		            version);
		system_info_length += mg_str_append(&buffer, end, block);
	}

	/* System info */
	{
#if defined(_WIN32)
		DWORD dwVersion = 0;
		DWORD dwMajorVersion = 0;
		DWORD dwMinorVersion = 0;
		SYSTEM_INFO si;

		GetSystemInfo(&si);

#if defined(_MSC_VER)
#pragma warning(push)
		/* GetVersion was declared deprecated */
#pragma warning(disable : 4996)
#endif
		dwVersion = GetVersion();
#if defined(_MSC_VER)
#pragma warning(pop)
#endif

		dwMajorVersion = (DWORD)(LOBYTE(LOWORD(dwVersion)));
		dwMinorVersion = (DWORD)(HIBYTE(LOWORD(dwVersion)));

		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"os\" : \"Windows %u.%u\"",
		            eol,
		            (unsigned)dwMajorVersion,
		            (unsigned)dwMinorVersion);
		system_info_length += mg_str_append(&buffer, end, block);

		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"cpu\" : \"type %u, cores %u, mask %x\"",
		            eol,
		            (unsigned)si.wProcessorArchitecture,
		            (unsigned)si.dwNumberOfProcessors,
		            (unsigned)si.dwActiveProcessorMask);
		system_info_length += mg_str_append(&buffer, end, block);
#elif defined(__ZEPHYR__)
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"os\" : \"%s %s\"",
		            eol,
		            "Zephyr OS",
		            ZEPHYR_VERSION);
		system_info_length += mg_str_append(&buffer, end, block);
#else
		struct utsname name;
		memset(&name, 0, sizeof(name));
		uname(&name);

		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"os\" : \"%s %s (%s) - %s\"",
		            eol,
		            name.sysname,
		            name.version,
		            name.release,
		            name.machine);
		system_info_length += mg_str_append(&buffer, end, block);
#endif
	}

	/* Features */
	{
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"features\" : %lu"
		            ",%s\"feature_list\" : \"Server:%s%s%s%s%s%s%s%s%s\"",
		            eol,
		            (unsigned long)mg_check_feature(0xFFFFFFFFu),
		            eol,
		            mg_check_feature(MG_FEATURES_FILES) ? " Files" : "",
		            mg_check_feature(MG_FEATURES_SSL) ? " HTTPS" : "",
		            mg_check_feature(MG_FEATURES_CGI) ? " CGI" : "",
		            mg_check_feature(MG_FEATURES_IPV6) ? " IPv6" : "",
		            mg_check_feature(MG_FEATURES_WEBSOCKET) ? " WebSockets"
		                                                    : "",
		            mg_check_feature(MG_FEATURES_LUA) ? " Lua" : "",
		            mg_check_feature(MG_FEATURES_SSJS) ? " JavaScript" : "",
		            mg_check_feature(MG_FEATURES_CACHE) ? " Cache" : "",
		            mg_check_feature(MG_FEATURES_STATS) ? " Stats" : "");
		system_info_length += mg_str_append(&buffer, end, block);

#if defined(USE_LUA)
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"lua_version\" : \"%u (%s)\"",
		            eol,
		            (unsigned)LUA_VERSION_NUM,
		            LUA_RELEASE);
		system_info_length += mg_str_append(&buffer, end, block);
#endif
#if defined(USE_DUKTAPE)
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"javascript\" : \"Duktape %u.%u.%u\"",
		            eol,
		            (unsigned)DUK_VERSION / 10000,
		            ((unsigned)DUK_VERSION / 100) % 100,
		            (unsigned)DUK_VERSION % 100);
		system_info_length += mg_str_append(&buffer, end, block);
#endif
	}

	/* Build identifier. If BUILD_DATE is not set, __DATE__ will be used. */
	{
#if defined(BUILD_DATE)
		const char *bd = BUILD_DATE;
#else
#if defined(GCC_DIAGNOSTIC)
#if GCC_VERSION >= 40900
#pragma GCC diagnostic push
		/* Disable idiotic compiler warning -Wdate-time, appeared in gcc5. This
		 * does not work in some versions. If "BUILD_DATE" is defined to some
		 * string, it is used instead of __DATE__. */
#pragma GCC diagnostic ignored "-Wdate-time"
#endif
#endif
		const char *bd = __DATE__;
#if defined(GCC_DIAGNOSTIC)
#if GCC_VERSION >= 40900
#pragma GCC diagnostic pop
#endif
#endif
#endif

		mg_snprintf(
		    NULL, NULL, block, sizeof(block), ",%s\"build\" : \"%s\"", eol, bd);

		system_info_length += mg_str_append(&buffer, end, block);
	}

	/* Compiler information */
	/* http://sourceforge.net/p/predef/wiki/Compilers/ */
	{
#if defined(_MSC_VER)
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"compiler\" : \"MSC: %u (%u)\"",
		            eol,
		            (unsigned)_MSC_VER,
		            (unsigned)_MSC_FULL_VER);
		system_info_length += mg_str_append(&buffer, end, block);
#elif defined(__MINGW64__)
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"compiler\" : \"MinGW64: %u.%u\"",
		            eol,
		            (unsigned)__MINGW64_VERSION_MAJOR,
		            (unsigned)__MINGW64_VERSION_MINOR);
		system_info_length += mg_str_append(&buffer, end, block);
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"compiler\" : \"MinGW32: %u.%u\"",
		            eol,
		            (unsigned)__MINGW32_MAJOR_VERSION,
		            (unsigned)__MINGW32_MINOR_VERSION);
		system_info_length += mg_str_append(&buffer, end, block);
#elif defined(__MINGW32__)
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"compiler\" : \"MinGW32: %u.%u\"",
		            eol,
		            (unsigned)__MINGW32_MAJOR_VERSION,
		            (unsigned)__MINGW32_MINOR_VERSION);
		system_info_length += mg_str_append(&buffer, end, block);
#elif defined(__clang__)
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"compiler\" : \"clang: %u.%u.%u (%s)\"",
		            eol,
		            __clang_major__,
		            __clang_minor__,
		            __clang_patchlevel__,
		            __clang_version__);
		system_info_length += mg_str_append(&buffer, end, block);
#elif defined(__GNUC__)
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"compiler\" : \"gcc: %u.%u.%u\"",
		            eol,
		            (unsigned)__GNUC__,
		            (unsigned)__GNUC_MINOR__,
		            (unsigned)__GNUC_PATCHLEVEL__);
		system_info_length += mg_str_append(&buffer, end, block);
#elif defined(__INTEL_COMPILER)
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"compiler\" : \"Intel C/C++: %u\"",
		            eol,
		            (unsigned)__INTEL_COMPILER);
		system_info_length += mg_str_append(&buffer, end, block);
#elif defined(__BORLANDC__)
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"compiler\" : \"Borland C: 0x%x\"",
		            eol,
		            (unsigned)__BORLANDC__);
		system_info_length += mg_str_append(&buffer, end, block);
#elif defined(__SUNPRO_C)
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"compiler\" : \"Solaris: 0x%x\"",
		            eol,
		            (unsigned)__SUNPRO_C);
		system_info_length += mg_str_append(&buffer, end, block);
#else
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"compiler\" : \"other\"",
		            eol);
		system_info_length += mg_str_append(&buffer, end, block);
#endif
	}

	/* Determine 32/64 bit data mode.
	 * see https://en.wikipedia.org/wiki/64-bit_computing */
	{
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"data_model\" : \"int:%u/%u/%u/%u, float:%u/%u/%u, "
		            "char:%u/%u, "
		            "ptr:%u, size:%u, time:%u\"",
		            eol,
		            (unsigned)sizeof(short),
		            (unsigned)sizeof(int),
		            (unsigned)sizeof(long),
		            (unsigned)sizeof(long long),
		            (unsigned)sizeof(float),
		            (unsigned)sizeof(double),
		            (unsigned)sizeof(long double),
		            (unsigned)sizeof(char),
		            (unsigned)sizeof(wchar_t),
		            (unsigned)sizeof(void *),
		            (unsigned)sizeof(size_t),
		            (unsigned)sizeof(time_t));
		system_info_length += mg_str_append(&buffer, end, block);
	}

	/* Terminate string */
	if (append_eoobj) {
		strcat(append_eoobj, eoobj);
	}
	system_info_length += sizeof(eoobj) - 1;

	return (int)system_info_length;
}